

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

Sign GEO::PCK::orient_2d(double *p0,double *p1,double *p2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Sign SVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  expansion local_118;
  expansion local_f8;
  expansion local_d8;
  expansion local_b8;
  expansion local_98 [6];
  
  dVar1 = *p1;
  dVar2 = p1[1];
  dVar3 = *p0;
  dVar4 = p0[1];
  dVar5 = *p2;
  dVar6 = p2[1];
  local_f8.x_[1] = dVar5 - dVar3;
  local_b8.x_[1] = dVar1 - dVar3;
  local_118.x_[1] = dVar6 - dVar4;
  local_d8.x_[1] = dVar2 - dVar4;
  auVar9._0_8_ = ABS(local_118.x_[1]);
  auVar9._8_8_ = ABS(local_d8.x_[1]);
  auVar10._8_8_ = ABS(local_b8.x_[1]);
  auVar10._0_8_ = ABS(local_f8.x_[1]);
  auVar10 = maxpd(auVar9,auVar10);
  dVar11 = auVar10._8_8_;
  dVar13 = auVar10._0_8_;
  dVar8 = dVar13;
  if ((dVar13 < dVar11) || (dVar12 = dVar13, dVar8 = dVar11, dVar13 <= dVar11)) {
    dVar12 = dVar11;
  }
  if ((5.0036808196096464e-147 <= dVar8) && (dVar12 <= 1.675975991242824e+153)) {
    dVar8 = dVar11 * dVar13 * 8.88720573725928e-16;
    dVar13 = local_b8.x_[1] * local_118.x_[1] - local_f8.x_[1] * local_d8.x_[1];
    if (dVar8 < dVar13) {
      return POSITIVE;
    }
    if (dVar13 < -dVar8) {
      return NEGATIVE;
    }
  }
  local_b8.length_ = 2;
  local_b8.capacity_ = 2;
  local_b8.x_[0] =
       (dVar1 - (local_b8.x_[1] + (dVar1 - local_b8.x_[1]))) + ((dVar1 - local_b8.x_[1]) - dVar3);
  local_d8.length_ = 2;
  local_d8.capacity_ = 2;
  local_d8.x_[0] =
       (dVar2 - (local_d8.x_[1] + (dVar2 - local_d8.x_[1]))) + ((dVar2 - local_d8.x_[1]) - dVar4);
  local_f8.length_ = 2;
  local_f8.capacity_ = 2;
  local_f8.x_[0] =
       (dVar5 - (local_f8.x_[1] + (dVar5 - local_f8.x_[1]))) + ((dVar5 - local_f8.x_[1]) - dVar3);
  local_118.length_ = 2;
  local_118.capacity_ = 2;
  local_118.x_[0] =
       (dVar6 - (local_118.x_[1] + (dVar6 - local_118.x_[1]))) + ((dVar6 - local_118.x_[1]) - dVar4)
  ;
  local_98[0].length_ = 0;
  local_98[0].capacity_ = 0x10;
  expansion::assign_det2x2(local_98,&local_b8,&local_d8,&local_f8,&local_118);
  if (local_98[0].length_ == 0) {
    SVar7 = ZERO;
  }
  else {
    SVar7 = POSITIVE;
    if (local_98[0].x_[local_98[0].length_ - 1] <= 0.0) {
      SVar7 = -(uint)(local_98[0].x_[local_98[0].length_ - 1] < 0.0);
    }
  }
  return SVar7;
}

Assistant:

inline int orient_2d_filter( const double* p0, const double* p1, const double* p2) {
    double a11;
    a11 = (p1[0] - p0[0]);
    double a12;
    a12 = (p1[1] - p0[1]);
    double a21;
    a21 = (p2[0] - p0[0]);
    double a22;
    a22 = (p2[1] - p0[1]);
    double Delta;
    Delta = ((a11 * a22) - (a12 * a21));
    int int_tmp_result;
    double eps;
    double max1 = fabs(a11);
    if( (max1 < fabs(a12)) )
    {
        max1 = fabs(a12);
    } 
    double max2 = fabs(a21);
    if( (max2 < fabs(a22)) )
    {
        max2 = fabs(a22);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 5.00368081960964635413e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.67597599124282407923e+153) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (8.88720573725927976811e-16 * (max1 * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}